

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_string.cpp
# Opt level: O1

string * duckdb::StandardStringCast<duckdb::interval_t>
                   (string *__return_storage_ptr__,interval_t input)

{
  char *pcVar1;
  char *in_RCX;
  interval_t interval;
  Vector v;
  char buffer [70];
  LogicalType LStack_f8;
  Vector local_e0;
  anon_union_16_2_67f50693_for_value local_78;
  undefined8 local_68;
  LogicalType LStack_60;
  data_ptr_t local_48;
  unsigned_long *puStack_40;
  element_type *local_38;
  undefined6 uStack_30;
  undefined2 uStack_2a;
  undefined6 uStack_28;
  
  LogicalType::LogicalType(&LStack_f8,VARCHAR);
  Vector::Vector(&local_e0,&LStack_f8,0x800);
  LogicalType::~LogicalType(&LStack_f8);
  local_38 = (element_type *)0x0;
  uStack_30 = 0;
  local_48 = (data_ptr_t)0x0;
  puStack_40 = (unsigned_long *)0x0;
  LStack_60.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  LStack_60.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_68._0_1_ = FLAT_VECTOR;
  local_68._1_7_ = 0;
  LStack_60.id_ = INVALID;
  LStack_60.physical_type_ = ~INVALID;
  LStack_60._2_6_ = 0;
  uStack_2a = 0;
  uStack_28 = 0;
  interval.micros = (int64_t)&local_68;
  interval.months = (int)input.micros;
  interval.days = (int)((ulong)input.micros >> 0x20);
  pcVar1 = (char *)IntervalToStringCast::Format(input._0_8_,interval,in_RCX);
  local_78.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       StringVector::AddString((StringVector *)&local_e0,(Vector *)&local_68,pcVar1,(idx_t)in_RCX);
  pcVar1 = local_78._8_8_;
  if ((ulong)local_78._0_4_ < 0xd) {
    pcVar1 = local_78.pointer.prefix;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + local_78._0_4_);
  if (local_e0.auxiliary.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e0.auxiliary.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_e0.buffer.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e0.buffer.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  LogicalType::~LogicalType(&local_e0.type);
  return __return_storage_ptr__;
}

Assistant:

string StandardStringCast(T input) {
	Vector v(LogicalType::VARCHAR);
	return StringCast::Operation(input, v).GetString();
}